

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::api::KeyApi::CreateKeyPair
          (KeyApi *this,bool is_compressed,Pubkey *pubkey,string *wif,NetType net_type)

{
  Pubkey *in_RCX;
  byte in_DL;
  Privkey *in_RDI;
  string *in_R8;
  NetType in_R9D;
  Pubkey out_pubkey;
  Privkey *privkey;
  string local_78;
  Pubkey local_48;
  byte local_2d;
  NetType local_2c;
  string *local_28;
  Pubkey *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_2d = 0;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  core::Privkey::GenerageRandomKey();
  core::Privkey::GeneratePubkey(&local_48,in_RDI,(bool)(local_11 & 1));
  if (local_20 != (Pubkey *)0x0) {
    core::Pubkey::operator=(local_20,&local_48);
  }
  if (local_28 != (string *)0x0) {
    core::Privkey::ConvertWif_abi_cxx11_(&local_78,in_RDI,local_2c,(bool)(local_11 & 1));
    std::__cxx11::string::operator=(local_28,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  local_2d = 1;
  core::Pubkey::~Pubkey((Pubkey *)0x63ef2f);
  if ((local_2d & 1) == 0) {
    core::Privkey::~Privkey((Privkey *)0x63ef40);
  }
  return in_RDI;
}

Assistant:

Privkey KeyApi::CreateKeyPair(
    bool is_compressed, Pubkey* pubkey, std::string* wif, NetType net_type) {
  // generate random private key
  Privkey privkey = Privkey::GenerageRandomKey();

  // derive pubkey from private key
  const Pubkey out_pubkey = privkey.GeneratePubkey(is_compressed);

  if (pubkey != nullptr) {
    *pubkey = out_pubkey;
  }

  if (wif != nullptr) {
    *wif = privkey.ConvertWif(net_type, is_compressed);
  }
  return privkey;
}